

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  undefined1 uVar1;
  int iVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  char *__s;
  Message *message;
  AssertHelper *this_00;
  char *in_RSI;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_;
  char *partial_regex;
  char *full_pattern;
  size_t full_regex_len;
  char (*in_stack_ffffffffffffff48) [52];
  Message *in_stack_ffffffffffffff50;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  Type type;
  string local_78 [40];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  
  type = (Type)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pbVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           posix::StrDup((char *)0x1c4511);
  ((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *)&in_RDI->data_)->ptr_ = pbVar3;
  sVar4 = strlen(in_RSI);
  __s = (char *)operator_new__(sVar4 + 10);
  snprintf(__s,sVar4 + 10,"^(%s)$",in_RSI);
  iVar2 = regcomp((regex_t *)(in_RDI + 2),__s,1);
  *(bool *)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&in_RDI[1].data_)->ptr_ = iVar2 == 0;
  if (((ulong)((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&in_RDI[1].data_)->ptr_ & 1) != 0) {
    if (*in_RSI == '\0') {
      in_RSI = "()";
    }
    iVar2 = regcomp((regex_t *)(in_RDI + 10),in_RSI,1);
    type = (Type)((ulong)in_RSI >> 0x20);
    *(bool *)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&in_RDI[1].data_)->ptr_ = iVar2 == 0;
  }
  this_01 = (AssertionResult *)&stack0xffffffffffffffc8;
  AssertionResult::AssertionResult<bool>(this_01,(bool *)(in_RDI + 1),(type *)0x0);
  uVar1 = AssertionResult::operator_cast_to_bool(this_01);
  iVar2 = (int)((ulong)this_01 >> 0x20);
  if (!(bool)uVar1) {
    Message::Message((Message *)in_RDI);
    message = Message::operator<<(in_stack_ffffffffffffff50,(char (*) [21])in_stack_ffffffffffffff48
                                 );
    Message::operator<<(in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
    this_00 = (AssertHelper *)
              Message::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0.ptr_);
    std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              (in_RDI,type,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff70),iVar2,(char *)message);
    AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffd0.ptr_,(Message *)in_stack_ffffffffffffffc8);
    AssertHelper::~AssertHelper(this_00);
    std::__cxx11::string::~string(local_78);
    Message::~Message((Message *)&stack0xffffffffffffffb0);
  }
  AssertionResult::~AssertionResult((AssertionResult *)&stack0xffffffffffffffc8);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}